

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O2

void __thiscall
psy::C::Parser::DiagnosticsReporter::ExpectedTokenOfCategory
          (DiagnosticsReporter *this,Category category,string *id)

{
  SyntaxToken *this_00;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string s;
  string local_a0;
  DiagnosticDescriptor local_80;
  
  to_string_abi_cxx11_(&local_a0,(C *)CONCAT44(in_register_00000034,category),(Category)id);
  std::operator+(&local_e0,"expected ",&local_a0);
  std::operator+(&local_180,&local_e0," got `");
  this_00 = peek(this->parser_,1);
  SyntaxToken::valueText_abi_cxx11_(&local_100,this_00);
  std::operator+(&local_80.id_,&local_180,&local_100);
  std::operator+(&s,&local_80.id_,"\'");
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string(local_120,(string *)id);
  std::__cxx11::string::string<std::allocator<char>>
            (local_140,"[[expected token of category]]",(allocator<char> *)&local_180);
  std::__cxx11::string::string(local_160,(string *)&s);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_80,local_120,local_140,local_160,2,1);
  diagnoseOrDelayDiagnostic(this,&local_80);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_80);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void Parser::DiagnosticsReporter::ExpectedTokenOfCategory(SyntaxToken::Category category,
                                                          const std::string& id)
{
    std::string s = "expected "
            + to_string(category)
            + " got `"
            + parser_->peek().valueText() + "'";

    diagnoseOrDelayDiagnostic(
                DiagnosticDescriptor(id,
                                     "[[expected token of category]]",
                                     s,
                                     DiagnosticSeverity::Error,
                                     DiagnosticCategory::Syntax));
}